

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

int coda_product_variable_set_init_expression
              (coda_product_variable *product_variable,coda_expression *init_expr)

{
  int iVar1;
  
  if (init_expr != (coda_expression *)0x0) {
    if (product_variable->init_expr == (coda_expression *)0x0) {
      product_variable->init_expr = init_expr;
      iVar1 = 0;
    }
    else {
      coda_set_error(-400,"product variable already has an init expression");
      iVar1 = -1;
    }
    return iVar1;
  }
  __assert_fail("init_expr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0x73,
                "int coda_product_variable_set_init_expression(coda_product_variable *, coda_expression *)"
               );
}

Assistant:

int coda_product_variable_set_init_expression(coda_product_variable *product_variable, coda_expression *init_expr)
{
    assert(init_expr != NULL);
    if (product_variable->init_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product variable already has an init expression");
        return -1;
    }
    product_variable->init_expr = init_expr;
    return 0;
}